

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Group.cxx
# Opt level: O2

void __thiscall Fl_Group::draw_outside_label(Fl_Group *this,Fl_Widget *widget)

{
  int iVar1;
  int X;
  undefined4 extraout_var;
  int iVar2;
  int H;
  int Y;
  uint a;
  int iVar3;
  int W;
  
  if ((widget->flags_ & 2) != 0) {
    return;
  }
  a = (widget->label_).align_;
  if ((char)((a & 0x10) >> 4) != '\0' || (a & 0xf) == 0) {
    return;
  }
  X = widget->x_;
  Y = widget->y_;
  W = widget->w_;
  H = widget->h_;
  iVar1 = (*(this->super_Fl_Widget)._vptr_Fl_Widget[8])();
  iVar3 = 0;
  iVar2 = 0;
  if (CONCAT44(extraout_var,iVar1) == 0) {
    iVar3 = (this->super_Fl_Widget).x_;
    iVar2 = (this->super_Fl_Widget).y_;
  }
  switch(a & 0xf) {
  case 7:
    a = a & 0xffffffe0 | 9;
    break;
  default:
    if ((a & 1) == 0) {
      if ((a & 2) == 0) {
        if ((a & 4) == 0) {
          if ((a & 8) != 0) {
            a = a ^ 0xc;
            X = X + W + 3;
            W = (iVar3 - X) + (this->super_Fl_Widget).w_;
          }
        }
        else {
          a = a ^ 0xc;
          W = (widget->x_ - iVar3) + -3;
          X = iVar3;
        }
      }
      else {
        a = a ^ 3;
        Y = Y + H;
        H = (iVar2 - Y) + (this->super_Fl_Widget).h_;
      }
    }
    else {
      a = a ^ 3;
      H = widget->y_ - iVar2;
      Y = iVar2;
    }
    goto LAB_001ae1c9;
  case 0xb:
    a = a & 0xffffffe0 | 5;
    goto LAB_001ae1ab;
  case 0xd:
    a = a & 0xffffffe0 | 10;
    break;
  case 0xe:
    a = a & 0xffffffe6;
LAB_001ae1ab:
    X = X + W + 3;
    W = (iVar3 - X) + (this->super_Fl_Widget).w_;
    goto LAB_001ae1c9;
  }
  W = (widget->x_ - iVar3) + -3;
  X = iVar3;
LAB_001ae1c9:
  Fl_Widget::draw_label(widget,X,Y,W,H,a);
  return;
}

Assistant:

void Fl_Group::draw_outside_label(const Fl_Widget& widget) const {
  if (!widget.visible()) return;
  // skip any labels that are inside the widget:
  if (!(widget.align()&15) || (widget.align() & FL_ALIGN_INSIDE)) return;
  // invent a box that is outside the widget:
  Fl_Align a = widget.align();
  int X = widget.x();
  int Y = widget.y();
  int W = widget.w();
  int H = widget.h();
  int wx, wy;
  if (const_cast<Fl_Group*>(this)->as_window()) {
    wx = wy = 0;
  } else {
    wx = x(); wy = y();
  }
  if ( (a & 0x0f) == FL_ALIGN_LEFT_TOP ) {
    a = (a &~0x0f ) | FL_ALIGN_TOP_RIGHT;
    X = wx;
    W = widget.x()-X-3;
  } else if ( (a & 0x0f) == FL_ALIGN_LEFT_BOTTOM ) {
    a = (a &~0x0f ) | FL_ALIGN_BOTTOM_RIGHT; 
    X = wx;
    W = widget.x()-X-3;
  } else if ( (a & 0x0f) == FL_ALIGN_RIGHT_TOP ) {
    a = (a &~0x0f ) | FL_ALIGN_TOP_LEFT; 
    X = X+W+3;
    W = wx+this->w()-X;
  } else if ( (a & 0x0f) == FL_ALIGN_RIGHT_BOTTOM ) {
    a = (a &~0x0f ) | FL_ALIGN_BOTTOM_LEFT; 
    X = X+W+3;
    W = wx+this->w()-X;
  } else if (a & FL_ALIGN_TOP) {
    a ^= (FL_ALIGN_BOTTOM|FL_ALIGN_TOP);
    Y = wy;
    H = widget.y()-Y;
  } else if (a & FL_ALIGN_BOTTOM) {
    a ^= (FL_ALIGN_BOTTOM|FL_ALIGN_TOP);
    Y = Y+H;
    H = wy+h()-Y;
  } else if (a & FL_ALIGN_LEFT) {
    a ^= (FL_ALIGN_LEFT|FL_ALIGN_RIGHT);
    X = wx;
    W = widget.x()-X-3;
  } else if (a & FL_ALIGN_RIGHT) {
    a ^= (FL_ALIGN_LEFT|FL_ALIGN_RIGHT);
    X = X+W+3;
    W = wx+this->w()-X;
  }
  widget.draw_label(X,Y,W,H,(Fl_Align)a);
}